

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToRGB565DitherRow_AVX2(uint8_t *src,uint8_t *dst,uint32_t dither4,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar9 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  uint32_t dither4_local;
  
  auVar11._4_4_ = dither4;
  auVar11._0_4_ = dither4;
  auVar11._8_4_ = dither4;
  auVar11._12_4_ = dither4;
  auVar11 = vpunpcklbw_avx(auVar11,auVar11);
  auVar9 = vpermq_avx2(ZEXT1632(auVar11),0xd8);
  auVar3 = vpunpcklwd_avx2(auVar9,auVar9);
  auVar9 = vpcmpeqb_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
  auVar8 = vpsrld_avx2(auVar9,0x1b);
  auVar9 = vpcmpeqb_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar9 = vpsrld_avx2(auVar9,0x1a);
  auVar9 = vpslld_avx2(auVar9,5);
  auVar10 = vpslld_avx2(auVar8,0xb);
  do {
    auVar2 = vpaddusb_avx2(*(undefined1 (*) [32])src,auVar3);
    auVar7 = vpsrld_avx2(auVar2,5);
    auVar6 = vpsrld_avx2(auVar2,3);
    auVar5 = vpsrld_avx2(auVar2,8);
    auVar2 = vpand_avx2(auVar7,auVar9);
    auVar6 = vpand_avx2(auVar6,auVar8);
    auVar5 = vpand_avx2(auVar5,auVar10);
    auVar2 = vpor_avx2(auVar6,auVar2);
    auVar2 = vpor_avx2(auVar5,auVar2);
    auVar2 = vpackusdw_avx2(auVar2,auVar2);
    auVar2 = vpermq_avx2(auVar2,0xd8);
    src = (uint8_t *)((long)src + 0x20);
    *(undefined1 (*) [16])dst = auVar2._0_16_;
    dst = (uint8_t *)((long)dst + 0x10);
    iVar4 = width + -8;
    bVar1 = 7 < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToRGB565DitherRow_AVX2(const uint8_t* src,
                                uint8_t* dst,
                                const uint32_t dither4,
                                int width) {
  asm volatile(
      "vbroadcastss %3,%%xmm6                    \n"
      "vpunpcklbw  %%xmm6,%%xmm6,%%xmm6          \n"
      "vpermq      $0xd8,%%ymm6,%%ymm6           \n"
      "vpunpcklwd  %%ymm6,%%ymm6,%%ymm6          \n"
      "vpcmpeqb    %%ymm3,%%ymm3,%%ymm3          \n"
      "vpsrld      $0x1b,%%ymm3,%%ymm3           \n"
      "vpcmpeqb    %%ymm4,%%ymm4,%%ymm4          \n"
      "vpsrld      $0x1a,%%ymm4,%%ymm4           \n"
      "vpslld      $0x5,%%ymm4,%%ymm4            \n"
      "vpslld      $0xb,%%ymm3,%%ymm5            \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vpaddusb    %%ymm6,%%ymm0,%%ymm0          \n"
      "vpsrld      $0x5,%%ymm0,%%ymm2            \n"
      "vpsrld      $0x3,%%ymm0,%%ymm1            \n"
      "vpsrld      $0x8,%%ymm0,%%ymm0            \n"
      "vpand       %%ymm4,%%ymm2,%%ymm2          \n"
      "vpand       %%ymm3,%%ymm1,%%ymm1          \n"
      "vpand       %%ymm5,%%ymm0,%%ymm0          \n"
      "vpor        %%ymm2,%%ymm1,%%ymm1          \n"
      "vpor        %%ymm1,%%ymm0,%%ymm0          \n"
      "vpackusdw   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "lea         0x20(%0),%0                   \n"
      "vmovdqu     %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),    // %0
        "+r"(dst),    // %1
        "+r"(width)   // %2
      : "m"(dither4)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}